

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool map_keys(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  uint32_t n;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 data;
  gravity_value_t value;
  
  pgVar1 = (args->field_1).p;
  n = gravity_hash_count((gravity_hash_t *)pgVar1->objclass);
  data.p = (gravity_object_t *)gravity_list_new(vm,n);
  gravity_hash_iterate((gravity_hash_t *)pgVar1->objclass,map_keys_array,data.p);
  value.field_1.p = (gravity_object_t *)data.n;
  value.isa = (data.p)->isa;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool map_keys (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(nargs)
    gravity_map_t *map = VALUE_AS_MAP(GET_VALUE(0));
    uint32_t count = gravity_hash_count(map->hash);

    gravity_list_t *list = gravity_list_new(vm, count);
    gravity_hash_iterate(map->hash, map_keys_array, (void *)list);
    RETURN_VALUE(VALUE_FROM_OBJECT(list), rindex);
}